

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

int __thiscall gvr::Mesh::getUsedVertices(Mesh *this,vector<bool,_std::allocator<bool>_> *vused)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Mesh *in_RDI;
  bool in_stack_00000027;
  size_type in_stack_00000028;
  int i_2;
  int count;
  int i_1;
  int i;
  reference in_stack_ffffffffffffffa8;
  int local_48;
  int local_44;
  reference local_40;
  int local_2c;
  reference local_28;
  int local_14;
  
  PointCloud::getVertexCount(&in_RDI->super_PointCloud);
  std::vector<bool,_std::allocator<bool>_>::resize(_i_2,in_stack_00000028,in_stack_00000027);
  for (local_14 = 0; iVar3 = local_14, iVar2 = PointCloud::getVertexCount(&in_RDI->super_PointCloud)
      , iVar3 < iVar2; local_14 = local_14 + 1) {
    local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffa8._M_mask,
                          (size_type)in_stack_ffffffffffffffa8._M_p);
    std::_Bit_reference::operator=(&local_28,false);
  }
  local_2c = getTriangleCount(in_RDI);
  local_2c = local_2c * 3;
  while (local_2c = local_2c + -1, -1 < local_2c) {
    local_40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffa8._M_mask,
                          (size_type)in_stack_ffffffffffffffa8._M_p);
    std::_Bit_reference::operator=(&local_40,true);
  }
  local_44 = 0;
  for (local_48 = 0; iVar3 = PointCloud::getVertexCount(&in_RDI->super_PointCloud), local_48 < iVar3
      ; local_48 = local_48 + 1) {
    in_stack_ffffffffffffffa8 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffa8._M_mask,
                    (size_type)in_stack_ffffffffffffffa8._M_p);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa8);
    if (bVar1) {
      local_44 = local_44 + 1;
    }
  }
  return local_44;
}

Assistant:

int Mesh::getUsedVertices(std::vector<bool> &vused)
{
  vused.resize(getVertexCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=3*getTriangleCount()-1; i>=0; i--)
  {
    vused[triangle[i]]=true;
  }

  int count=0;

  for (int i=0; i<getVertexCount(); i++)
    if (vused[i])
    {
      count++;
    }

  return count;
}